

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_gf2m.c
# Opt level: O0

int BN_GF2m_mod_mul(BIGNUM *r,BIGNUM *a,BIGNUM *b,BIGNUM *p,BN_CTX *ctx)

{
  int iVar1;
  char *func;
  BIGNUM *in_RCX;
  int *in_R8;
  int *arr;
  int max;
  int ret;
  BIGNUM *in_stack_00000040;
  BIGNUM *in_stack_00000048;
  int max_00;
  int local_4;
  
  max_00 = 0;
  iVar1 = BN_num_bits(in_RCX);
  func = (char *)CRYPTO_malloc((iVar1 + 1) * 4,"crypto/bn/bn_gf2m.c",0x1dc);
  if (func == (char *)0x0) {
    ERR_new();
    ERR_set_debug((char *)in_R8,max_00,func);
    ERR_set_error(3,0xc0100,(char *)0x0);
    local_4 = 0;
  }
  else {
    local_4 = BN_GF2m_poly2arr((BIGNUM *)in_RCX,in_R8,max_00);
    if ((local_4 == 0) || (iVar1 + 1 < local_4)) {
      ERR_new();
      ERR_set_debug((char *)in_R8,local_4,func);
      ERR_set_error(3,0x6a,(char *)0x0);
    }
    else {
      local_4 = BN_GF2m_mod_mul_arr(in_stack_00000048,in_stack_00000040,r,(int *)a,(BN_CTX *)b);
    }
    CRYPTO_free(func);
  }
  return local_4;
}

Assistant:

int BN_GF2m_mod_mul(BIGNUM *r, const BIGNUM *a, const BIGNUM *b,
                    const BIGNUM *p, BN_CTX *ctx)
{
    int ret = 0;
    const int max = BN_num_bits(p) + 1;
    int *arr;

    bn_check_top(a);
    bn_check_top(b);
    bn_check_top(p);

    arr = OPENSSL_malloc(sizeof(*arr) * max);
    if (arr == NULL) {
        ERR_raise(ERR_LIB_BN, ERR_R_MALLOC_FAILURE);
        return 0;
    }
    ret = BN_GF2m_poly2arr(p, arr, max);
    if (!ret || ret > max) {
        ERR_raise(ERR_LIB_BN, BN_R_INVALID_LENGTH);
        goto err;
    }
    ret = BN_GF2m_mod_mul_arr(r, a, b, arr, ctx);
    bn_check_top(r);
 err:
    OPENSSL_free(arr);
    return ret;
}